

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::utp_socket_manager::utp_socket_manager
          (utp_socket_manager *this,send_fun_t *send_fun,incoming_utp_callback_t *cb,io_context *ios
          ,session_settings *sett,counters *cnt,void *ssl_context)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  
  *(undefined8 *)&(this->m_send_fun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_send_fun).super__Function_base._M_functor + 8) = 0;
  (this->m_send_fun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_send_fun)._M_invoker = send_fun->_M_invoker;
  if ((send_fun->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(send_fun->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->m_send_fun).super__Function_base._M_functor =
         *(undefined8 *)&(send_fun->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->m_send_fun).super__Function_base._M_functor + 8) = uVar2;
    (this->m_send_fun).super__Function_base._M_manager = (send_fun->super__Function_base)._M_manager
    ;
    (send_fun->super__Function_base)._M_manager = (_Manager_type)0x0;
    send_fun->_M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->m_cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_cb).super__Function_base._M_functor + 8) = 0;
  (this->m_cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_cb)._M_invoker = cb->_M_invoker;
  if ((cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->m_cb).super__Function_base._M_functor =
         *(undefined8 *)&(cb->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->m_cb).super__Function_base._M_functor + 8) = uVar2;
    (this->m_cb).super__Function_base._M_manager = (cb->super__Function_base)._M_manager;
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
  }
  p_Var1 = &(this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header;
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_deferred_ack = (utp_socket_impl *)0x0;
  (this->m_temp_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_temp_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_temp_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_drained_event).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_drained_event).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_drained_event).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_stalled_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_stalled_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_stalled_sockets).
  super__Vector_base<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_last_socket = (utp_socket_impl *)0x0;
  this->m_new_connection = -1;
  this->m_sett = sett;
  this->m_counters = cnt;
  this->m_ios = ios;
  this->m_mtu_idx = 0;
  this->m_ssl_context = ssl_context;
  packet_pool::packet_pool(&this->m_packet_pool);
  (this->m_restrict_mtu)._M_elems[0] = 0x10000;
  (this->m_restrict_mtu)._M_elems[1] = 0x10000;
  (this->m_restrict_mtu)._M_elems[2] = 0x10000;
  return;
}

Assistant:

utp_socket_manager::utp_socket_manager(
		send_fun_t send_fun
		, incoming_utp_callback_t cb
		, io_context& ios
		, aux::session_settings const& sett
		, counters& cnt
		, void* ssl_context)
		: m_send_fun(std::move(send_fun))
		, m_cb(std::move(cb))
		, m_sett(sett)
		, m_counters(cnt)
		, m_ios(ios)
		, m_ssl_context(ssl_context)
	{
		m_restrict_mtu.fill(65536);
	}